

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

bool __thiscall
SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U>::contains
          (SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U> *this,InplaceStr *key)

{
  uint uVar1;
  uint uVar2;
  InplaceStr *pIVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  undefined8 in_RCX;
  InplaceStr local_48;
  
  uVar1 = this->bucketCount;
  uVar5 = InplaceStrHasher::operator()((InplaceStrHasher *)&local_48,*key);
  uVar6 = 0;
  do {
    bVar7 = (byte)in_RCX;
    uVar2 = this->bucketCount;
    if (uVar2 <= uVar6) {
LAB_0016e376:
      return (bool)(uVar6 < uVar2 & bVar7);
    }
    uVar5 = uVar5 & uVar1 - 1;
    pIVar3 = this->data;
    local_48.begin = (char *)0x0;
    local_48.end = (char *)0x0;
    bVar4 = InplaceStr::operator==(pIVar3 + uVar5,&local_48);
    if (bVar4) {
      bVar7 = 0;
      goto LAB_0016e376;
    }
    bVar4 = InplaceStr::operator==(pIVar3 + uVar5,key);
    if (bVar4) {
      bVar7 = 1;
      goto LAB_0016e376;
    }
    uVar5 = uVar5 + uVar6 + 1;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

bool contains(const Key& key)
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
				return false;

			if(item == key)
				return true;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return false;
	}